

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBVertexStreamsTest::getShaderInterface
          (XFBVertexStreamsTest *this,GLuint param_1,STAGES stage,string *out_interface)

{
  char *pcVar1;
  
  if (stage == GEOMETRY) {
    pcVar1 = 
    "layout (xfb_buffer = 1, xfb_stride = 64) out;\nlayout (xfb_buffer = 2, xfb_stride = 64) out;\nlayout (xfb_buffer = 3, xfb_stride = 64) out;\n\nlayout (stream = 0, xfb_buffer = 1, xfb_offset = 48) out vec4 goku;\nlayout (stream = 0, xfb_buffer = 1, xfb_offset = 32) out vec4 gohan;\nlayout (stream = 0, xfb_buffer = 1, xfb_offset = 16) out vec4 goten;\nlayout (stream = 1, xfb_buffer = 3, xfb_offset = 48) out vec4 picolo;\nlayout (stream = 1, xfb_buffer = 3, xfb_offset = 32) out vec4 vegeta;\nlayout (stream = 2, xfb_buffer = 2, xfb_offset = 32) out vec4 bulma;\n\nlayout(binding = 0) uniform gs_block {\n    vec4 uni_goku;\n    vec4 uni_gohan;\n    vec4 uni_goten;\n    vec4 uni_picolo;\n    vec4 uni_vegeta;\n    vec4 uni_bulma;\n};\n"
    ;
  }
  else {
    if (stage != FRAGMENT) {
      std::__cxx11::string::_M_replace
                ((ulong)out_interface,0,(char *)out_interface->_M_string_length,0x1b3c1e9);
      return;
    }
    pcVar1 = 
    "in vec4 goku;\nin vec4 gohan;\nin vec4 goten;\nin vec4 picolo;\nin vec4 vegeta;\nin vec4 bulma;\n\nout vec4 fs_out;\n"
    ;
  }
  std::__cxx11::string::_M_replace
            ((ulong)out_interface,0,(char *)out_interface->_M_string_length,(ulong)pcVar1);
  return;
}

Assistant:

void XFBVertexStreamsTest::getShaderInterface(GLuint /* test_case_index */, Utils::Shader::STAGES stage,
											  std::string& out_interface)
{
	static const GLchar* gs = "layout (xfb_buffer = 1, xfb_stride = 64) out;\n"
							  "layout (xfb_buffer = 2, xfb_stride = 64) out;\n"
							  "layout (xfb_buffer = 3, xfb_stride = 64) out;\n"
							  "\n"
							  "layout (stream = 0, xfb_buffer = 1, xfb_offset = 48) out vec4 goku;\n"
							  "layout (stream = 0, xfb_buffer = 1, xfb_offset = 32) out vec4 gohan;\n"
							  "layout (stream = 0, xfb_buffer = 1, xfb_offset = 16) out vec4 goten;\n"
							  "layout (stream = 1, xfb_buffer = 3, xfb_offset = 48) out vec4 picolo;\n"
							  "layout (stream = 1, xfb_buffer = 3, xfb_offset = 32) out vec4 vegeta;\n"
							  "layout (stream = 2, xfb_buffer = 2, xfb_offset = 32) out vec4 bulma;\n"
							  "\n"
							  "layout(binding = 0) uniform gs_block {\n"
							  "    vec4 uni_goku;\n"
							  "    vec4 uni_gohan;\n"
							  "    vec4 uni_goten;\n"
							  "    vec4 uni_picolo;\n"
							  "    vec4 uni_vegeta;\n"
							  "    vec4 uni_bulma;\n"
							  "};\n";
	/*
	 Fixed incorrect usage of in/out qualifier, the following variable should be input symbols for fragment shader
	 */
	static const GLchar* fs = "in vec4 goku;\n"
							  "in vec4 gohan;\n"
							  "in vec4 goten;\n"
							  "in vec4 picolo;\n"
							  "in vec4 vegeta;\n"
							  "in vec4 bulma;\n"
							  "\n"
							  "out vec4 fs_out;\n";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		out_interface = fs;
		break;
	case Utils::Shader::GEOMETRY:
		out_interface = gs;
		break;
	default:
		out_interface = "";
		return;
	}
}